

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

double __thiscall ON_PolyEdgeCurve::EdgeParameter(ON_PolyEdgeCurve *this,double t)

{
  bool bVar1;
  int segment_index_00;
  ON_PolyEdgeSegment *this_00;
  double dVar2;
  double s;
  ON_Interval sdom;
  ON_Interval pdom;
  ON_PolyEdgeSegment *seg;
  double dStack_20;
  int segment_index;
  double edge_t;
  double t_local;
  ON_PolyEdgeCurve *this_local;
  
  dStack_20 = -1.23432101234321e+308;
  segment_index_00 = ON_PolyCurve::SegmentIndex(&this->super_ON_PolyCurve,t);
  this_00 = SegmentCurve(this,segment_index_00);
  if (this_00 != (ON_PolyEdgeSegment *)0x0) {
    join_0x00001240_0x00001200_ =
         ON_PolyCurve::SegmentDomain(&this->super_ON_PolyCurve,segment_index_00);
    dVar2 = sdom._16_8_;
    (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    sdom.m_t[0] = dVar2;
    bVar1 = ON_Interval::operator!=((ON_Interval *)&s,(ON_Interval *)(sdom.m_t + 1));
    edge_t = t;
    if (bVar1) {
      dVar2 = ON_Interval::NormalizedParameterAt((ON_Interval *)(sdom.m_t + 1),t);
      edge_t = ON_Interval::ParameterAt((ON_Interval *)&s,dVar2);
    }
    dStack_20 = ON_PolyEdgeSegment::EdgeParameter(this_00,edge_t);
  }
  return dStack_20;
}

Assistant:

double ON_PolyEdgeCurve::EdgeParameter(double t) const
{
  double edge_t = ON_UNSET_VALUE;
  int segment_index = SegmentIndex(t);
  ON_PolyEdgeSegment* seg = SegmentCurve( segment_index );
  if ( seg )
  {
    ON_Interval pdom = SegmentDomain(segment_index);
    ON_Interval sdom = seg->Domain();
    if ( sdom != pdom )
    {
      double s = pdom.NormalizedParameterAt(t);
      t = sdom.ParameterAt(s);
    }
    edge_t = seg->EdgeParameter(t);
  }
  return edge_t;
}